

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Question *pQVar4;
  uint in_EDX;
  undefined4 in_register_00000034;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_00;
  uint local_1c;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *pEStack_18;
  uint id_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_local;
  
  this_00 = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
            CONCAT44(in_register_00000034,id);
  local_1c = in_EDX;
  pEStack_18 = this_00;
  this_local = this;
  bVar1 = isHigh(this_00,&local_1c);
  if (bVar1) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::
    find<unsigned_int&>((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>
                         *)this,(uint *)&this_00->highSlots);
  }
  else {
    uVar2 = (ulong)local_1c;
    sVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::size
                      ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)this_00);
    if (uVar2 < sVar3) {
      pQVar4 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                         ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)this_00,
                          (ulong)local_1c);
      bVar1 = RpcSystemBase::RpcConnectionState::Question::operator==(pQVar4,(void *)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pQVar4 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                           ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)this_00
                            ,(ulong)local_1c);
        kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>::Maybe
                  ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> *)this,pQVar4);
        return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>)(Question *)this;
      }
    }
    kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>::Maybe
              ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> *)this);
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>)(Question *)this;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    if (isHigh(id)) {
      return highSlots.find(id);
    } else if (id < slots.size() && slots[id] != nullptr) {
      return slots[id];
    } else {
      return kj::none;
    }
  }